

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O0

void __thiscall
vkt::QueryPool::anon_unknown_0::StateObjects::StateObjects
          (StateObjects *this,DeviceInterface *vk,Context *context,int numVertices,
          VkPrimitiveTopology primitive)

{
  undefined1 *this_00;
  VkFormat _format;
  StencilOpState _front;
  RefData<vk::Handle<(vk::HandleType)13>_> data;
  RefData<vk::Handle<(vk::HandleType)13>_> data_00;
  RefData<vk::Handle<(vk::HandleType)17>_> data_01;
  RefData<vk::Handle<(vk::HandleType)23>_> data_02;
  RefData<vk::Handle<(vk::HandleType)14>_> data_03;
  RefData<vk::Handle<(vk::HandleType)14>_> data_04;
  RefData<vk::Handle<(vk::HandleType)16>_> data_05;
  RefData<vk::Handle<(vk::HandleType)18>_> data_06;
  VkAttachmentDescription attachment;
  VkAttachmentDescription attachment_00;
  VkSubpassDescription subpass;
  StencilOpState _back;
  VkExtent3D _extent;
  VkExtent3D _extent_00;
  VkDevice device_00;
  Allocator *pAVar1;
  Image *pIVar2;
  Handle<(vk::HandleType)13> *pHVar3;
  reference pvVar4;
  Handle<(vk::HandleType)17> *pHVar5;
  ProgramCollection<vk::ProgramBinary> *pPVar6;
  ProgramBinary *pPVar7;
  Handle<(vk::HandleType)16> *pHVar8;
  Handle<(vk::HandleType)14> *pHVar9;
  BufferCreateInfo local_f38;
  undefined1 local_ee8 [24];
  size_t kBufferSize;
  Move<vk::Handle<(vk::HandleType)18>_> local_ec8;
  RefData<vk::Handle<(vk::HandleType)18>_> local_ea8;
  allocator<unsigned_int> local_e85;
  value_type_conflict1 local_e84;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e80;
  MultiSampleState local_e68;
  VkPipelineRasterizationStateCreateInfo local_e20;
  VkStencilOpState local_de0;
  VkStencilOpState local_dc0;
  VkPipelineDepthStencilStateCreateInfo local_da0;
  allocator<vk::VkRect2D> local_d31;
  vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> local_d30;
  allocator<vk::VkViewport> local_d11;
  vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> local_d10;
  ViewportState local_cf8;
  undefined1 auStack_c98 [8];
  VkRect2D scissor;
  VkViewport viewport;
  VkPipelineInputAssemblyStateCreateInfo local_c20;
  deUint64 local_c00;
  VkPipelineShaderStageCreateInfo local_bf8;
  deUint64 local_bc8;
  VkPipelineShaderStageCreateInfo local_bc0;
  deUint64 local_b90;
  VkPipelineLayout local_b88;
  undefined1 local_b80 [8];
  PipelineCreateInfo pipelineCreateInfo;
  VkPipelineVertexInputStateCreateInfo vf_info;
  VkVertexInputAttributeDescription vf_attribute_desc;
  VkVertexInputBindingDescription vf_binding_desc;
  RefData<vk::Handle<(vk::HandleType)16>_> local_828;
  vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_> local_808
  ;
  undefined1 local_7e8 [8];
  PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
  Attachment attachmentState;
  Move<vk::Handle<(vk::HandleType)14>_> local_740;
  RefData<vk::Handle<(vk::HandleType)14>_> local_720;
  undefined1 local_700 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> fs;
  string local_6d8;
  Move<vk::Handle<(vk::HandleType)14>_> local_6b8;
  RefData<vk::Handle<(vk::HandleType)14>_> local_698;
  undefined1 local_678 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> vs;
  RefData<vk::Handle<(vk::HandleType)23>_> local_638;
  deUint64 local_618;
  undefined1 local_610 [8];
  FramebufferCreateInfo framebufferCreateInfo;
  undefined1 local_5c8 [8];
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  attachments;
  RefData<vk::Handle<(vk::HandleType)17>_> local_590;
  undefined8 local_570;
  SubpassDescription local_568;
  VkSubpassDescription local_4b8;
  undefined8 local_470;
  VkAttachmentReference depthAttachmentReference;
  VkAttachmentReference colorAttachmentReference;
  undefined4 uStack_458;
  undefined8 uStack_454;
  undefined8 local_44c;
  undefined8 uStack_444;
  VkImageLayout local_43c;
  VkAttachmentDescription local_40c;
  VkAttachmentDescription local_3e8;
  undefined1 local_3c0 [8];
  RenderPassCreateInfo renderPassCreateInfo;
  RefData<vk::Handle<(vk::HandleType)13>_> local_2d0;
  VkComponentMapping local_2b0;
  VkImage local_2a0;
  undefined1 local_298 [8];
  ImageViewCreateInfo depthViewInfo;
  undefined1 local_240 [48];
  undefined1 local_210 [8];
  ImageCreateInfo depthImageCreateInfo;
  RefData<vk::Handle<(vk::HandleType)13>_> local_180;
  VkComponentMapping local_160;
  VkImage local_150;
  undefined1 local_148 [8];
  ImageViewCreateInfo attachmentViewInfo;
  undefined1 local_f0 [48];
  undefined1 local_c0 [8];
  ImageCreateInfo colorImageCreateInfo;
  VkExtent3D imageExtent;
  VkDevice device;
  VkFormat depthFormat;
  VkPrimitiveTopology primitive_local;
  int numVertices_local;
  Context *context_local;
  DeviceInterface *vk_local;
  StateObjects *this_local;
  
  this->m_context = context;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::Move(&this->m_pipeline);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::Move(&this->m_pipelineLayout);
  de::SharedPtr<vkt::Draw::Image>::SharedPtr(&this->m_colorAttachmentImage);
  de::SharedPtr<vkt::Draw::Image>::SharedPtr(&this->m_DepthImage);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_attachmentView);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_depthiew);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::Move(&this->m_renderPass);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::Move(&this->m_framebuffer);
  de::SharedPtr<vkt::Draw::Buffer>::SharedPtr(&this->m_vertexBuffer);
  this->m_colorAttachmentFormat = VK_FORMAT_R8G8B8A8_UNORM;
  device_00 = Context::getDevice(this->m_context);
  colorImageCreateInfo.m_queueFamilyIndices.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x8000000080;
  local_f0._40_4_ = 1;
  local_f0._32_8_ = (VkDevice)0x8000000080;
  local_f0._24_4_ = 1;
  local_f0._16_8_ = 0x8000000080;
  _extent_00.depth = 1;
  _extent_00.width = 0x80;
  _extent_00.height = 0x80;
  Draw::ImageCreateInfo::ImageCreateInfo
            ((ImageCreateInfo *)local_c0,VK_IMAGE_TYPE_2D,this->m_colorAttachmentFormat,_extent_00,1
             ,1,VK_SAMPLE_COUNT_1_BIT,VK_IMAGE_TILING_OPTIMAL,0x11,VK_SHARING_MODE_EXCLUSIVE,0,
             (deUint32 *)0x0,0,VK_IMAGE_LAYOUT_UNDEFINED);
  pAVar1 = Context::getDefaultAllocator(this->m_context);
  attachmentViewInfo.super_VkImageViewCreateInfo._76_4_ = ::vk::MemoryRequirement::Any.m_flags;
  Draw::Image::createAndAlloc
            ((Image *)local_f0,vk,device_00,(VkImageCreateInfo *)local_c0,pAVar1,
             ::vk::MemoryRequirement::Any);
  de::SharedPtr<vkt::Draw::Image>::operator=
            (&this->m_colorAttachmentImage,(SharedPtr<vkt::Draw::Image> *)local_f0);
  de::SharedPtr<vkt::Draw::Image>::~SharedPtr((SharedPtr<vkt::Draw::Image> *)local_f0);
  pIVar2 = de::SharedPtr<vkt::Draw::Image>::operator->(&this->m_colorAttachmentImage);
  local_150 = Draw::Image::object(pIVar2);
  _format = this->m_colorAttachmentFormat;
  Draw::ComponentMapping::ComponentMapping
            ((ComponentMapping *)&local_160,VK_COMPONENT_SWIZZLE_R,VK_COMPONENT_SWIZZLE_G,
             VK_COMPONENT_SWIZZLE_B,VK_COMPONENT_SWIZZLE_A);
  Draw::ImageViewCreateInfo::ImageViewCreateInfo
            ((ImageViewCreateInfo *)local_148,local_150,VK_IMAGE_VIEW_TYPE_2D,_format,&local_160,0);
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)
             &depthImageCreateInfo.m_queueFamilyIndices.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,vk,device_00,
             (VkImageViewCreateInfo *)local_148,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_180,
             (Move *)&depthImageCreateInfo.m_queueFamilyIndices.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  data.deleter.m_deviceIface._0_4_ = (int)local_180.deleter.m_deviceIface;
  data.object.m_internal = local_180.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_180.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_180.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_180.deleter.m_device >> 0x20);
  data.deleter.m_allocator._0_4_ = (int)local_180.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_180.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::operator=(&this->m_attachmentView,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)13>_> *)
             &depthImageCreateInfo.m_queueFamilyIndices.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_240._40_4_ = 1;
  local_240._32_8_ =
       colorImageCreateInfo.m_queueFamilyIndices.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_240._24_4_ = 1;
  local_240._16_8_ =
       colorImageCreateInfo.m_queueFamilyIndices.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  _extent.depth = 1;
  _extent._0_8_ =
       colorImageCreateInfo.m_queueFamilyIndices.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  Draw::ImageCreateInfo::ImageCreateInfo
            ((ImageCreateInfo *)local_210,VK_IMAGE_TYPE_2D,VK_FORMAT_D16_UNORM,_extent,1,1,
             VK_SAMPLE_COUNT_1_BIT,VK_IMAGE_TILING_OPTIMAL,0x20,VK_SHARING_MODE_EXCLUSIVE,0,
             (deUint32 *)0x0,0,VK_IMAGE_LAYOUT_UNDEFINED);
  pAVar1 = Context::getDefaultAllocator(this->m_context);
  depthViewInfo.super_VkImageViewCreateInfo._76_4_ = ::vk::MemoryRequirement::Any.m_flags;
  Draw::Image::createAndAlloc
            ((Image *)local_240,vk,device_00,(VkImageCreateInfo *)local_210,pAVar1,
             ::vk::MemoryRequirement::Any);
  de::SharedPtr<vkt::Draw::Image>::operator=
            (&this->m_DepthImage,(SharedPtr<vkt::Draw::Image> *)local_240);
  de::SharedPtr<vkt::Draw::Image>::~SharedPtr((SharedPtr<vkt::Draw::Image> *)local_240);
  pIVar2 = de::SharedPtr<vkt::Draw::Image>::operator->(&this->m_DepthImage);
  local_2a0 = Draw::Image::object(pIVar2);
  Draw::ComponentMapping::ComponentMapping
            ((ComponentMapping *)&local_2b0,VK_COMPONENT_SWIZZLE_R,VK_COMPONENT_SWIZZLE_G,
             VK_COMPONENT_SWIZZLE_B,VK_COMPONENT_SWIZZLE_A);
  Draw::ImageViewCreateInfo::ImageViewCreateInfo
            ((ImageViewCreateInfo *)local_298,local_2a0,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_D16_UNORM,
             &local_2b0,0);
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)
             &renderPassCreateInfo.m_dependiencesStructs.
              super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,vk,device_00,
             (VkImageViewCreateInfo *)local_298,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_2d0,
             (Move *)&renderPassCreateInfo.m_dependiencesStructs.
                      super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_2d0.deleter.m_deviceIface;
  data_00.object.m_internal = local_2d0.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2d0.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_2d0.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_2d0.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_2d0.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_2d0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::operator=(&this->m_depthiew,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)13>_> *)
             &renderPassCreateInfo.m_dependiencesStructs.
              super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  Draw::ImageCreateInfo::~ImageCreateInfo((ImageCreateInfo *)local_210);
  Draw::ImageCreateInfo::~ImageCreateInfo((ImageCreateInfo *)local_c0);
  Draw::RenderPassCreateInfo::RenderPassCreateInfo
            ((RenderPassCreateInfo *)local_3c0,0,(VkAttachmentDescription *)0x0,0,
             (VkSubpassDescription *)0x0,0,(VkSubpassDependency *)0x0);
  Draw::AttachmentDescription::AttachmentDescription
            ((AttachmentDescription *)&local_40c,this->m_colorAttachmentFormat,VK_SAMPLE_COUNT_1_BIT
             ,VK_ATTACHMENT_LOAD_OP_CLEAR,VK_ATTACHMENT_STORE_OP_DONT_CARE,
             VK_ATTACHMENT_LOAD_OP_DONT_CARE,VK_ATTACHMENT_STORE_OP_DONT_CARE,
             VK_IMAGE_LAYOUT_GENERAL,VK_IMAGE_LAYOUT_GENERAL);
  local_3e8.finalLayout = local_40c.finalLayout;
  local_3e8.storeOp = local_40c.storeOp;
  local_3e8.stencilLoadOp = local_40c.stencilLoadOp;
  local_3e8.stencilStoreOp = local_40c.stencilStoreOp;
  local_3e8.initialLayout = local_40c.initialLayout;
  local_3e8.flags = local_40c.flags;
  local_3e8.format = local_40c.format;
  local_3e8.samples = local_40c.samples;
  local_3e8.loadOp = local_40c.loadOp;
  attachment.samples = local_40c.samples;
  attachment.flags = local_40c.flags;
  attachment.format = local_40c.format;
  attachment.loadOp = local_40c.loadOp;
  attachment.storeOp = local_40c.storeOp;
  attachment.stencilLoadOp = local_40c.stencilLoadOp;
  attachment.stencilStoreOp = local_40c.stencilStoreOp;
  attachment.initialLayout = local_40c.initialLayout;
  attachment.finalLayout = local_40c.finalLayout;
  Draw::RenderPassCreateInfo::addAttachment((RenderPassCreateInfo *)local_3c0,attachment);
  Draw::AttachmentDescription::AttachmentDescription
            ((AttachmentDescription *)&colorAttachmentReference.layout,VK_FORMAT_D16_UNORM,
             VK_SAMPLE_COUNT_1_BIT,VK_ATTACHMENT_LOAD_OP_CLEAR,VK_ATTACHMENT_STORE_OP_DONT_CARE,
             VK_ATTACHMENT_LOAD_OP_DONT_CARE,VK_ATTACHMENT_STORE_OP_DONT_CARE,
             VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL);
  attachment_00.samples = (int)uStack_454;
  attachment_00.flags = colorAttachmentReference.layout;
  attachment_00.format = uStack_458;
  attachment_00.loadOp = (int)((ulong)uStack_454 >> 0x20);
  attachment_00.storeOp = (int)local_44c;
  attachment_00.stencilLoadOp = (int)((ulong)local_44c >> 0x20);
  attachment_00.stencilStoreOp = (int)uStack_444;
  attachment_00.initialLayout = (int)((ulong)uStack_444 >> 0x20);
  attachment_00.finalLayout = local_43c;
  Draw::RenderPassCreateInfo::addAttachment((RenderPassCreateInfo *)local_3c0,attachment_00);
  depthAttachmentReference.attachment = 0;
  depthAttachmentReference.layout = VK_IMAGE_LAYOUT_GENERAL;
  local_470 = 0x300000001;
  local_570 = 0x300000001;
  Draw::SubpassDescription::SubpassDescription
            (&local_568,VK_PIPELINE_BIND_POINT_GRAPHICS,0,0,(VkAttachmentReference *)0x0,1,
             &depthAttachmentReference,(VkAttachmentReference *)0x0,
             (VkAttachmentReference)0x300000001,0,(deUint32 *)0x0);
  local_4b8.pPreserveAttachments = local_568.super_VkSubpassDescription.pPreserveAttachments;
  local_4b8.pDepthStencilAttachment = local_568.super_VkSubpassDescription.pDepthStencilAttachment;
  local_4b8.preserveAttachmentCount = local_568.super_VkSubpassDescription.preserveAttachmentCount;
  local_4b8._60_4_ = local_568.super_VkSubpassDescription._60_4_;
  local_4b8.pColorAttachments = local_568.super_VkSubpassDescription.pColorAttachments;
  local_4b8.pResolveAttachments = local_568.super_VkSubpassDescription.pResolveAttachments;
  local_4b8.pInputAttachments = local_568.super_VkSubpassDescription.pInputAttachments;
  local_4b8.colorAttachmentCount = local_568.super_VkSubpassDescription.colorAttachmentCount;
  local_4b8._28_4_ = local_568.super_VkSubpassDescription._28_4_;
  local_4b8.flags = local_568.super_VkSubpassDescription.flags;
  local_4b8.pipelineBindPoint = local_568.super_VkSubpassDescription.pipelineBindPoint;
  local_4b8.inputAttachmentCount = local_568.super_VkSubpassDescription.inputAttachmentCount;
  local_4b8._12_4_ = local_568.super_VkSubpassDescription._12_4_;
  subpass.inputAttachmentCount = local_568.super_VkSubpassDescription.inputAttachmentCount;
  subpass.flags = local_568.super_VkSubpassDescription.flags;
  subpass.pipelineBindPoint = local_568.super_VkSubpassDescription.pipelineBindPoint;
  subpass._12_4_ = local_568.super_VkSubpassDescription._12_4_;
  subpass.pInputAttachments._0_4_ = (int)local_568.super_VkSubpassDescription.pInputAttachments;
  subpass.pInputAttachments._4_4_ =
       (int)((ulong)local_568.super_VkSubpassDescription.pInputAttachments >> 0x20);
  subpass.colorAttachmentCount = local_568.super_VkSubpassDescription.colorAttachmentCount;
  subpass._28_4_ = local_568.super_VkSubpassDescription._28_4_;
  subpass.pColorAttachments._0_4_ = (int)local_568.super_VkSubpassDescription.pColorAttachments;
  subpass.pColorAttachments._4_4_ =
       (int)((ulong)local_568.super_VkSubpassDescription.pColorAttachments >> 0x20);
  subpass.pResolveAttachments._0_4_ = (int)local_568.super_VkSubpassDescription.pResolveAttachments;
  subpass.pResolveAttachments._4_4_ =
       (int)((ulong)local_568.super_VkSubpassDescription.pResolveAttachments >> 0x20);
  subpass.pDepthStencilAttachment._0_4_ =
       (int)local_568.super_VkSubpassDescription.pDepthStencilAttachment;
  subpass.pDepthStencilAttachment._4_4_ =
       (int)((ulong)local_568.super_VkSubpassDescription.pDepthStencilAttachment >> 0x20);
  subpass.preserveAttachmentCount = local_568.super_VkSubpassDescription.preserveAttachmentCount;
  subpass._60_4_ = local_568.super_VkSubpassDescription._60_4_;
  subpass.pPreserveAttachments._0_4_ =
       (int)local_568.super_VkSubpassDescription.pPreserveAttachments;
  subpass.pPreserveAttachments._4_4_ =
       (int)((ulong)local_568.super_VkSubpassDescription.pPreserveAttachments >> 0x20);
  Draw::RenderPassCreateInfo::addSubpass((RenderPassCreateInfo *)local_3c0,subpass);
  Draw::SubpassDescription::~SubpassDescription(&local_568);
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &attachments.
              super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,vk,device_00,
             (VkRenderPassCreateInfo *)local_3c0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_590,
             (Move *)&attachments.
                      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_590.deleter.m_deviceIface;
  data_01.object.m_internal = local_590.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_590.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_590.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_590.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator._0_4_ = (int)local_590.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_590.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::operator=(&this->m_renderPass,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &attachments.
              super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00 = &framebufferCreateInfo.super_VkFramebufferCreateInfo.field_0x3f;
  std::allocator<vk::Handle<(vk::HandleType)13>_>::allocator
            ((allocator<vk::Handle<(vk::HandleType)13>_> *)this_00);
  std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  vector((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_> *
         )local_5c8,2,(allocator_type *)this_00);
  std::allocator<vk::Handle<(vk::HandleType)13>_>::~allocator
            ((allocator<vk::Handle<(vk::HandleType)13>_> *)
             &framebufferCreateInfo.super_VkFramebufferCreateInfo.field_0x3f);
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                     (&(this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  pvVar4 = std::
           vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
           ::operator[]((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                         *)local_5c8,0);
  pvVar4->m_internal = pHVar3->m_internal;
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                     (&(this->m_depthiew).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  pvVar4 = std::
           vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
           ::operator[]((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                         *)local_5c8,1);
  pvVar4->m_internal = pHVar3->m_internal;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  local_618 = pHVar5->m_internal;
  Draw::FramebufferCreateInfo::FramebufferCreateInfo
            ((FramebufferCreateInfo *)local_610,(VkRenderPass)local_618,
             (vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
              *)local_5c8,0x80,0x80,1);
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)
             &vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator,vk,
             device_00,(VkFramebufferCreateInfo *)local_610,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_638,
             (Move *)&vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_638.deleter.m_deviceIface;
  data_02.object.m_internal = local_638.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_638.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device._0_4_ = (int)local_638.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_638.deleter.m_device >> 0x20);
  data_02.deleter.m_allocator._0_4_ = (int)local_638.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_638.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::operator=(&this->m_framebuffer,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)23>_> *)
             &vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator);
  std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  ~vector((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
           *)local_5c8);
  Draw::RenderPassCreateInfo::~RenderPassCreateInfo((RenderPassCreateInfo *)local_3c0);
  pPVar6 = Context::getBinaryCollection(this->m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d8,"vert",
             (allocator<char> *)
             ((long)&fs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator +
             7));
  pPVar7 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar6,&local_6d8);
  ::vk::createShaderModule(&local_6b8,vk,device_00,pPVar7,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_698,(Move *)&local_6b8);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_698.deleter.m_deviceIface;
  data_03.object.m_internal = local_698.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_698.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device._0_4_ = (int)local_698.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_698.deleter.m_device >> 0x20);
  data_03.deleter.m_allocator._0_4_ = (int)local_698.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_698.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_678,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_6b8);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&fs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator +
             7));
  pPVar6 = Context::getBinaryCollection(this->m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&attachmentState.super_VkPipelineColorBlendAttachmentState.colorWriteMask,
             "frag",(allocator<char> *)
                    ((long)&attachmentState.super_VkPipelineColorBlendAttachmentState.alphaBlendOp +
                    3));
  pPVar7 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                     (pPVar6,(string *)
                             &attachmentState.super_VkPipelineColorBlendAttachmentState.
                              colorWriteMask);
  ::vk::createShaderModule(&local_740,vk,device_00,pPVar7,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_720,(Move *)&local_740);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_720.deleter.m_deviceIface;
  data_04.object.m_internal = local_720.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_720.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device._0_4_ = (int)local_720.deleter.m_device;
  data_04.deleter.m_device._4_4_ = (int)((ulong)local_720.deleter.m_device >> 0x20);
  data_04.deleter.m_allocator._0_4_ = (int)local_720.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_720.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_700,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_740);
  std::__cxx11::string::~string
            ((string *)&attachmentState.super_VkPipelineColorBlendAttachmentState.colorWriteMask);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&attachmentState.super_VkPipelineColorBlendAttachmentState.alphaBlendOp + 3));
  Draw::PipelineCreateInfo::ColorBlendState::Attachment::Attachment
            ((Attachment *)
             ((long)&pipelineLayoutCreateInfo.m_pushConstantRanges.
                     super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0,
             VK_BLEND_FACTOR_SRC_COLOR,VK_BLEND_FACTOR_DST_COLOR,VK_BLEND_OP_ADD,
             VK_BLEND_FACTOR_SRC_COLOR,VK_BLEND_FACTOR_DST_COLOR,VK_BLEND_OP_ADD,0xf);
  local_808.
  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_808.
  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_808.
  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
  vector(&local_808);
  Draw::PipelineLayoutCreateInfo::PipelineLayoutCreateInfo
            ((PipelineLayoutCreateInfo *)local_7e8,&local_808,0,(VkPushConstantRange *)0x0);
  std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
  ~vector(&local_808);
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&vf_binding_desc.inputRate,vk,device_00,
             (VkPipelineLayoutCreateInfo *)local_7e8,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_828,(Move *)&vf_binding_desc.inputRate);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_828.deleter.m_deviceIface;
  data_05.object.m_internal = local_828.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_828.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device._0_4_ = (int)local_828.deleter.m_device;
  data_05.deleter.m_device._4_4_ = (int)((ulong)local_828.deleter.m_device >> 0x20);
  data_05.deleter.m_allocator._0_4_ = (int)local_828.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_828.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::operator=
            (&this->m_pipelineLayout,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&vf_binding_desc.inputRate);
  vf_attribute_desc.format = VK_FORMAT_UNDEFINED;
  vf_attribute_desc.offset = 0x10;
  vf_binding_desc.binding = 0;
  vf_info.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  vf_attribute_desc.location = 0x6d;
  vf_attribute_desc.binding = 0;
  pipelineCreateInfo.m_multisampleStateSampleMask.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x13;
  vf_info.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vf_info._4_4_ = 0;
  vf_info.pNext._0_4_ = 0;
  vf_info.pNext._4_4_ = 1;
  vf_info._16_8_ = &vf_attribute_desc.format;
  vf_info.pVertexBindingDescriptions._0_4_ = 1;
  vf_info._32_8_ = &vf_info.pVertexAttributeDescriptions;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  local_b88.m_internal = pHVar8->m_internal;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  local_b90 = pHVar5->m_internal;
  Draw::PipelineCreateInfo::PipelineCreateInfo
            ((PipelineCreateInfo *)local_b80,local_b88,(VkRenderPass)local_b90,0,0);
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_678);
  local_bc8 = pHVar9->m_internal;
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_bc0,(VkShaderModule)local_bc8,"main",
             VK_SHADER_STAGE_VERTEX_BIT);
  Draw::PipelineCreateInfo::addShader((PipelineCreateInfo *)local_b80,&local_bc0);
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_700);
  local_c00 = pHVar9->m_internal;
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_bf8,(VkShaderModule)local_c00,"main",
             VK_SHADER_STAGE_FRAGMENT_BIT);
  Draw::PipelineCreateInfo::addShader((PipelineCreateInfo *)local_b80,&local_bf8);
  Draw::PipelineCreateInfo::InputAssemblerState::InputAssemblerState
            ((InputAssemblerState *)&local_c20,primitive,0);
  Draw::PipelineCreateInfo::addState((PipelineCreateInfo *)local_b80,&local_c20);
  Draw::PipelineCreateInfo::ColorBlendState::ColorBlendState
            ((ColorBlendState *)&viewport.minDepth,1,
             (VkPipelineColorBlendAttachmentState *)
             ((long)&pipelineLayoutCreateInfo.m_pushConstantRanges.
                     super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0,VK_LOGIC_OP_COPY);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_b80,
             (VkPipelineColorBlendStateCreateInfo *)&viewport.minDepth);
  Draw::PipelineCreateInfo::ColorBlendState::~ColorBlendState((ColorBlendState *)&viewport.minDepth)
  ;
  viewport.width = 0.0;
  viewport.height = 1.0;
  scissor.extent.width = 0;
  scissor.extent.height = 0;
  viewport.x = 128.0;
  viewport.y = 128.0;
  auStack_c98._0_4_ = 0;
  auStack_c98._4_4_ = 0;
  scissor.offset.x = 0x80;
  scissor.offset.y = 0x80;
  std::allocator<vk::VkViewport>::allocator(&local_d11);
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::vector
            (&local_d10,1,(value_type *)&scissor.extent,&local_d11);
  std::allocator<vk::VkRect2D>::allocator(&local_d31);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::vector
            (&local_d30,1,(value_type *)auStack_c98,&local_d31);
  Draw::PipelineCreateInfo::ViewportState::ViewportState(&local_cf8,1,&local_d10,&local_d30);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_b80,&local_cf8.super_VkPipelineViewportStateCreateInfo);
  Draw::PipelineCreateInfo::ViewportState::~ViewportState(&local_cf8);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::~vector(&local_d30);
  std::allocator<vk::VkRect2D>::~allocator(&local_d31);
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::~vector(&local_d10);
  std::allocator<vk::VkViewport>::~allocator(&local_d11);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_dc0,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_de0,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  _front.super_VkStencilOpState.depthFailOp = local_dc0.depthFailOp;
  _front.super_VkStencilOpState.failOp = local_dc0.failOp;
  _front.super_VkStencilOpState.passOp = local_dc0.passOp;
  _front.super_VkStencilOpState.compareOp = local_dc0.compareOp;
  _front.super_VkStencilOpState.compareMask = local_dc0.compareMask;
  _front.super_VkStencilOpState.writeMask = local_dc0.writeMask;
  _front.super_VkStencilOpState.reference = local_dc0.reference;
  _back.super_VkStencilOpState.depthFailOp = local_de0.depthFailOp;
  _back.super_VkStencilOpState.failOp = local_de0.failOp;
  _back.super_VkStencilOpState.passOp = local_de0.passOp;
  _back.super_VkStencilOpState.compareOp = local_de0.compareOp;
  _back.super_VkStencilOpState.compareMask = local_de0.compareMask;
  _back.super_VkStencilOpState.writeMask = local_de0.writeMask;
  _back.super_VkStencilOpState.reference = local_de0.reference;
  Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
            ((DepthStencilState *)&local_da0,1,1,VK_COMPARE_OP_GREATER_OR_EQUAL,0,0,_front,_back,0.0
             ,1.0);
  Draw::PipelineCreateInfo::addState((PipelineCreateInfo *)local_b80,&local_da0);
  Draw::PipelineCreateInfo::RasterizerState::RasterizerState
            ((RasterizerState *)&local_e20,0,0,VK_POLYGON_MODE_FILL,0,VK_FRONT_FACE_CLOCKWISE,1,0.0,
             0.0,0.0,1.0);
  Draw::PipelineCreateInfo::addState((PipelineCreateInfo *)local_b80,&local_e20);
  local_e84 = 0xffffffff;
  std::allocator<unsigned_int>::allocator(&local_e85);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_e80,1,&local_e84,&local_e85);
  Draw::PipelineCreateInfo::MultiSampleState::MultiSampleState
            (&local_e68,VK_SAMPLE_COUNT_1_BIT,0,0.0,&local_e80,false,false);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_b80,&local_e68.super_VkPipelineMultisampleStateCreateInfo);
  Draw::PipelineCreateInfo::MultiSampleState::~MultiSampleState(&local_e68);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_e80);
  std::allocator<unsigned_int>::~allocator(&local_e85);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_b80,
             (VkPipelineVertexInputStateCreateInfo *)
             &pipelineCreateInfo.m_multisampleStateSampleMask.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::vk::Handle<(vk::HandleType)15>::Handle((Handle<(vk::HandleType)15> *)&kBufferSize,0);
  ::vk::createGraphicsPipeline
            (&local_ec8,vk,device_00,(VkPipelineCache)kBufferSize,
             (VkGraphicsPipelineCreateInfo *)local_b80,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_ea8,(Move *)&local_ec8);
  data_06.deleter.m_deviceIface._0_4_ = (int)local_ea8.deleter.m_deviceIface;
  data_06.object.m_internal = local_ea8.object.m_internal;
  data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_ea8.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_device._0_4_ = (int)local_ea8.deleter.m_device;
  data_06.deleter.m_device._4_4_ = (int)((ulong)local_ea8.deleter.m_device >> 0x20);
  data_06.deleter.m_allocator._0_4_ = (int)local_ea8.deleter.m_allocator;
  data_06.deleter.m_allocator._4_4_ = (int)((ulong)local_ea8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::operator=(&this->m_pipeline,data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_ec8);
  Draw::PipelineCreateInfo::~PipelineCreateInfo((PipelineCreateInfo *)local_b80);
  Draw::PipelineLayoutCreateInfo::~PipelineLayoutCreateInfo((PipelineLayoutCreateInfo *)local_7e8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_700);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_678);
  local_ee8._16_8_ = (long)numVertices << 4;
  Draw::BufferCreateInfo::BufferCreateInfo
            (&local_f38,local_ee8._16_8_,0x20,VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0);
  pAVar1 = Context::getDefaultAllocator(this->m_context);
  Draw::Buffer::createAndAlloc
            ((Buffer *)local_ee8,vk,device_00,&local_f38.super_VkBufferCreateInfo,pAVar1,
             ::vk::MemoryRequirement::HostVisible);
  de::SharedPtr<vkt::Draw::Buffer>::operator=
            (&this->m_vertexBuffer,(SharedPtr<vkt::Draw::Buffer> *)local_ee8);
  de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr((SharedPtr<vkt::Draw::Buffer> *)local_ee8);
  Draw::BufferCreateInfo::~BufferCreateInfo(&local_f38);
  return;
}

Assistant:

StateObjects::StateObjects (const vk::DeviceInterface&vk, vkt::Context &context, const int numVertices, vk::VkPrimitiveTopology primitive)
	: m_context(context)
	, m_colorAttachmentFormat(vk::VK_FORMAT_R8G8B8A8_UNORM)

{
	vk::VkFormat		depthFormat = vk::VK_FORMAT_D16_UNORM;
	const vk::VkDevice	device		= m_context.getDevice();

	//attachment images and views
	{
		vk::VkExtent3D imageExtent =
		{
			WIDTH,	// width;
			HEIGHT,	// height;
			1		// depth;
		};

		const ImageCreateInfo colorImageCreateInfo(vk::VK_IMAGE_TYPE_2D, m_colorAttachmentFormat, imageExtent, 1, 1, vk::VK_SAMPLE_COUNT_1_BIT, vk::VK_IMAGE_TILING_OPTIMAL,
												   vk::VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | vk::VK_IMAGE_USAGE_TRANSFER_SRC_BIT);

		m_colorAttachmentImage	= Image::createAndAlloc(vk, device, colorImageCreateInfo, m_context.getDefaultAllocator());

		const ImageViewCreateInfo attachmentViewInfo(m_colorAttachmentImage->object(), vk::VK_IMAGE_VIEW_TYPE_2D, m_colorAttachmentFormat);
		m_attachmentView		= vk::createImageView(vk, device, &attachmentViewInfo);

		ImageCreateInfo depthImageCreateInfo(vk::VK_IMAGE_TYPE_2D, depthFormat, imageExtent, 1, 1, vk::VK_SAMPLE_COUNT_1_BIT, vk::VK_IMAGE_TILING_OPTIMAL,
			vk::VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT);

		m_DepthImage			= Image::createAndAlloc(vk, device, depthImageCreateInfo, m_context.getDefaultAllocator());

		// Construct a depth  view from depth image
		const ImageViewCreateInfo depthViewInfo(m_DepthImage->object(), vk::VK_IMAGE_VIEW_TYPE_2D, depthFormat);
		m_depthiew				= vk::createImageView(vk, device, &depthViewInfo);
	}

	{
		// Renderpass and Framebuffer

		RenderPassCreateInfo renderPassCreateInfo;
		renderPassCreateInfo.addAttachment(AttachmentDescription(m_colorAttachmentFormat,									// format
																	vk::VK_SAMPLE_COUNT_1_BIT,								// samples
																	vk::VK_ATTACHMENT_LOAD_OP_CLEAR,						// loadOp
																	vk::VK_ATTACHMENT_STORE_OP_DONT_CARE,					// storeOp
																	vk::VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// stencilLoadOp
																	vk::VK_ATTACHMENT_STORE_OP_DONT_CARE,					// stencilLoadOp
																	vk::VK_IMAGE_LAYOUT_GENERAL,							// initialLauout
																	vk::VK_IMAGE_LAYOUT_GENERAL));							// finalLayout

		renderPassCreateInfo.addAttachment(AttachmentDescription(depthFormat,												// format
																 vk::VK_SAMPLE_COUNT_1_BIT,									// samples
																 vk::VK_ATTACHMENT_LOAD_OP_CLEAR,							// loadOp
																 vk::VK_ATTACHMENT_STORE_OP_DONT_CARE,						// storeOp
																 vk::VK_ATTACHMENT_LOAD_OP_DONT_CARE,						// stencilLoadOp
																 vk::VK_ATTACHMENT_STORE_OP_DONT_CARE,						// stencilLoadOp
																 vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,		// initialLauout
																 vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL));	// finalLayout

		const vk::VkAttachmentReference colorAttachmentReference =
		{
			0,															// attachment
			vk::VK_IMAGE_LAYOUT_GENERAL									// layout
		};

		const vk::VkAttachmentReference depthAttachmentReference =
		{
			1,															// attachment
			vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL		// layout
		};

		renderPassCreateInfo.addSubpass(SubpassDescription(vk::VK_PIPELINE_BIND_POINT_GRAPHICS,					// pipelineBindPoint
														   0,													// flags
														   0,													// inputCount
														   DE_NULL,												// pInputAttachments
														   1,													// colorCount
														   &colorAttachmentReference,							// pColorAttachments
														   DE_NULL,												// pResolveAttachments
														   depthAttachmentReference,							// depthStencilAttachment
														   0,													// preserveCount
														   DE_NULL));											// preserveAttachments

		m_renderPass = vk::createRenderPass(vk, device, &renderPassCreateInfo);

		std::vector<vk::VkImageView> attachments(2);
		attachments[0] = *m_attachmentView;
		attachments[1] = *m_depthiew;

		FramebufferCreateInfo framebufferCreateInfo(*m_renderPass, attachments, WIDTH, HEIGHT, 1);
		m_framebuffer = vk::createFramebuffer(vk, device, &framebufferCreateInfo);
	}

	{
		// Pipeline

		vk::Unique<vk::VkShaderModule> vs(vk::createShaderModule(vk, device, m_context.getBinaryCollection().get("vert"), 0));
		vk::Unique<vk::VkShaderModule> fs(vk::createShaderModule(vk, device, m_context.getBinaryCollection().get("frag"), 0));

		const PipelineCreateInfo::ColorBlendState::Attachment attachmentState;

		const PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
		m_pipelineLayout = vk::createPipelineLayout(vk, device, &pipelineLayoutCreateInfo);

		const vk::VkVertexInputBindingDescription vf_binding_desc		=
		{
			0,																// binding;
			4 * (deUint32)sizeof(float),									// stride;
			vk::VK_VERTEX_INPUT_RATE_VERTEX									// inputRate
		};

		const vk::VkVertexInputAttributeDescription vf_attribute_desc	=
		{
			0,																// location;
			0,																// binding;
			vk::VK_FORMAT_R32G32B32A32_SFLOAT,								// format;
			0																// offset;
		};

		const vk::VkPipelineVertexInputStateCreateInfo vf_info			=
		{																	// sType;
			vk::VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,	// pNext;
			NULL,															// flags;
			0u,																// vertexBindingDescriptionCount;
			1,																// pVertexBindingDescriptions;
			&vf_binding_desc,												// vertexAttributeDescriptionCount;
			1,																// pVertexAttributeDescriptions;
			&vf_attribute_desc
		};

		PipelineCreateInfo pipelineCreateInfo(*m_pipelineLayout, *m_renderPass, 0, 0);
		pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*vs, "main", vk::VK_SHADER_STAGE_VERTEX_BIT));
		pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*fs, "main", vk::VK_SHADER_STAGE_FRAGMENT_BIT));
		pipelineCreateInfo.addState(PipelineCreateInfo::InputAssemblerState(primitive));
		pipelineCreateInfo.addState(PipelineCreateInfo::ColorBlendState(1, &attachmentState));
		const vk::VkViewport viewport	=
		{
			0,		// float x;
			0,		// float y;
			WIDTH,	// float width;
			HEIGHT,	// float height;
			0.0f,	// float minDepth;
			1.0f	// float maxDepth;
		};

		const vk::VkRect2D scissor		=
		{
			{
				0,		// deInt32 x
				0,		// deInt32 y
			},		// VkOffset2D	offset;
			{
				WIDTH,	// deInt32 width;
				HEIGHT,	// deInt32 height
			},		// VkExtent2D	extent;
		};
		pipelineCreateInfo.addState(PipelineCreateInfo::ViewportState(1, std::vector<vk::VkViewport>(1, viewport), std::vector<vk::VkRect2D>(1, scissor)));
		pipelineCreateInfo.addState(PipelineCreateInfo::DepthStencilState(true, true, vk::VK_COMPARE_OP_GREATER_OR_EQUAL));
		pipelineCreateInfo.addState(PipelineCreateInfo::RasterizerState());
		pipelineCreateInfo.addState(PipelineCreateInfo::MultiSampleState());
		pipelineCreateInfo.addState(vf_info);
		m_pipeline = vk::createGraphicsPipeline(vk, device, DE_NULL, &pipelineCreateInfo);
	}

	{
		// Vertex buffer
		const size_t kBufferSize = numVertices * sizeof(tcu::Vec4);
		m_vertexBuffer = Buffer::createAndAlloc(vk, device, BufferCreateInfo(kBufferSize, vk::VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), m_context.getDefaultAllocator(), vk::MemoryRequirement::HostVisible);
	}
}